

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

Optional<unsigned_int> llvm::dwarf::LanguageLowerBound(SourceLanguage Lang)

{
  uint local_b0 [39];
  SourceLanguage local_14;
  OptionalStorage<unsigned_int,_true> OStack_10;
  SourceLanguage Lang_local;
  
  local_14 = Lang;
  if (Lang == DW_LANG_C89) {
    local_b0[0x26] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x26);
  }
  else if (Lang == DW_LANG_C) {
    local_b0[0x25] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x25);
  }
  else if (Lang == DW_LANG_Ada83) {
    local_b0[0x24] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x24);
  }
  else if (Lang == DW_LANG_C_plus_plus) {
    local_b0[0x23] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x23);
  }
  else if (Lang == DW_LANG_Cobol74) {
    local_b0[0x22] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x22);
  }
  else if (Lang == DW_LANG_Cobol85) {
    local_b0[0x21] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x21);
  }
  else if (Lang == DW_LANG_Fortran77) {
    local_b0[0x20] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x20);
  }
  else if (Lang == DW_LANG_Fortran90) {
    local_b0[0x1f] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x1f);
  }
  else if (Lang == DW_LANG_Pascal83) {
    local_b0[0x1e] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x1e);
  }
  else if (Lang == DW_LANG_Modula2) {
    local_b0[0x1d] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x1d);
  }
  else if (Lang == DW_LANG_Java) {
    local_b0[0x1c] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x1c);
  }
  else if (Lang == DW_LANG_C99) {
    local_b0[0x1b] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x1b);
  }
  else if (Lang == DW_LANG_Ada95) {
    local_b0[0x1a] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x1a);
  }
  else if (Lang == DW_LANG_Fortran95) {
    local_b0[0x19] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x19);
  }
  else if (Lang == DW_LANG_PLI) {
    local_b0[0x18] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x18);
  }
  else if (Lang == DW_LANG_ObjC) {
    local_b0[0x17] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x17);
  }
  else if (Lang == DW_LANG_ObjC_plus_plus) {
    local_b0[0x16] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x16);
  }
  else if (Lang == DW_LANG_UPC) {
    local_b0[0x15] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x15);
  }
  else if (Lang == DW_LANG_D) {
    local_b0[0x14] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x14);
  }
  else if (Lang == DW_LANG_Python) {
    local_b0[0x13] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x13);
  }
  else if (Lang == DW_LANG_OpenCL) {
    local_b0[0x12] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x12);
  }
  else if (Lang == DW_LANG_Go) {
    local_b0[0x11] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x11);
  }
  else if (Lang == DW_LANG_Modula3) {
    local_b0[0x10] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0x10);
  }
  else if (Lang == DW_LANG_Haskell) {
    local_b0[0xf] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0xf);
  }
  else if (Lang == DW_LANG_C_plus_plus_03) {
    local_b0[0xe] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0xe);
  }
  else if (Lang == DW_LANG_C_plus_plus_11) {
    local_b0[0xd] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0xd);
  }
  else if (Lang == DW_LANG_OCaml) {
    local_b0[0xc] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0xc);
  }
  else if (Lang == DW_LANG_Rust) {
    local_b0[0xb] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 0xb);
  }
  else if (Lang == DW_LANG_C11) {
    local_b0[10] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 10);
  }
  else if (Lang == DW_LANG_Swift) {
    local_b0[9] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 9);
  }
  else if (Lang == DW_LANG_Julia) {
    local_b0[8] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 8);
  }
  else if (Lang == DW_LANG_Dylan) {
    local_b0[7] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 7);
  }
  else if (Lang == DW_LANG_C_plus_plus_14) {
    local_b0[6] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 6);
  }
  else if (Lang == DW_LANG_Fortran03) {
    local_b0[5] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 5);
  }
  else if (Lang == DW_LANG_Fortran08) {
    local_b0[4] = 1;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 4);
  }
  else if (Lang == DW_LANG_RenderScript) {
    local_b0[3] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 3);
  }
  else if (Lang == DW_LANG_BLISS) {
    local_b0[2] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 2);
  }
  else if (Lang == DW_LANG_Mips_Assembler) {
    Optional<unsigned_int>::Optional((Optional<unsigned_int> *)&stack0xfffffffffffffff0,None);
  }
  else if (Lang == DW_LANG_GOOGLE_RenderScript) {
    local_b0[1] = 0;
    Optional<unsigned_int>::Optional
              ((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0 + 1);
  }
  else if (Lang == DW_LANG_BORLAND_Delphi) {
    local_b0[0] = 0;
    Optional<unsigned_int>::Optional((Optional<unsigned_int> *)&stack0xfffffffffffffff0,local_b0);
  }
  else {
    Optional<unsigned_int>::Optional((Optional<unsigned_int> *)&stack0xfffffffffffffff0,None);
  }
  return (Optional<unsigned_int>)OStack_10;
}

Assistant:

Optional<unsigned> llvm::dwarf::LanguageLowerBound(dwarf::SourceLanguage Lang) {
  switch (Lang) {
  default:
    return None;
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  case DW_LANG_##NAME:                                                         \
    return LOWER_BOUND;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}